

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pz81.hpp
# Opt level: O0

void ExchCXX::kernel_traits<ExchCXX::BuiltinPZ81>::eval_exc_vxc_polar_impl
               (double rho_a,double rho_b,double *eps,double *vrho_a,double *vrho_b)

{
  double *in_RDX;
  double *in_RSI;
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double in_XMM1_Qa;
  double dVar16;
  double dVar17;
  double t167;
  double t165;
  double t164;
  double t161;
  double t160;
  double t157;
  double t154;
  double t152;
  double t151;
  double t148;
  double t147;
  double t144;
  double t143;
  double t142;
  double t141;
  double t140;
  double t138;
  double t137;
  double t126;
  double t122;
  double t120;
  double t118;
  double t117;
  double t109;
  double t104;
  double t100;
  double t99;
  double t97;
  double t95;
  double t94;
  double t92;
  double t91;
  double t90;
  double t85;
  double t84;
  double t82;
  double t81;
  double t80;
  double t79;
  double t77;
  double t76;
  double t75;
  double t74;
  double t73;
  double t72;
  double t71;
  double t70;
  double t69;
  double t68;
  double t52;
  double t43;
  double t35;
  double t29;
  double t25;
  double t22;
  double t16;
  double t13;
  double t12;
  double t11;
  double t10;
  double t9;
  double t8;
  double t7;
  double t64;
  double t60;
  double t59;
  double t55;
  double t49;
  double t45;
  double t44;
  double t39;
  double t34;
  double t33;
  double t28;
  double t21;
  double t20;
  double t15;
  double t14;
  double t6;
  double t87;
  double t5;
  double t3;
  double t1;
  
  dVar1 = in_XMM0_Qa + in_XMM1_Qa;
  dVar2 = safe_math::cbrt<double>(9.83075023862954e-318);
  dVar3 = (1.0 / dVar2) * 2.519842099789747;
  dVar4 = (double)(-(ulong)(1.0 <= dVar3 * 0.9847450218426962 * 0.25) & 0x3ff0000000000000);
  dVar5 = safe_math::sqrt<double>(9.83170378532601e-318);
  dVar6 = (1.0 / dVar2) * 1.720508027656199;
  dVar7 = dVar5 * 1.0529 * 0.5 + 1.0 + dVar6 * 0.4808460067404899 * 0.25;
  dVar8 = safe_math::log<double>(9.83242018051248e-318);
  dVar3 = dVar3 * dVar8;
  dVar9 = piecewise_functor_3<double>
                    ((bool)(-(dVar4 != 0.0) & 1),-0.1423 / dVar7,
                     dVar8 * 0.0311 + -0.048 + dVar3 * 0.0019694900436853925 * 0.25 +
                     dVar6 * -0.016730095015565934 * 0.25);
  dVar16 = dVar5 * 1.3981 * 0.5 + 1.0 + dVar6 * 0.37657136280726433 * 0.25;
  dVar6 = piecewise_functor_3<double>
                    ((bool)(-(dVar4 != 0.0) & 1),-0.0843 / dVar16,
                     dVar8 * 0.01555 + -0.0269 + dVar3 * 0.0006893215152898874 * 0.25 +
                     dVar6 * -0.0069227979374755595 * 0.25);
  dVar6 = dVar6 - dVar9;
  dVar3 = 1.0 / dVar1;
  dVar10 = (in_XMM0_Qa - in_XMM1_Qa) * dVar3;
  dVar11 = dVar10 + 1.0;
  dVar17 = (double)(-(ulong)(dVar11 <= 1e-15) & 0x3ff0000000000000);
  dVar12 = safe_math::cbrt<double>(9.83560690392816e-318);
  dVar13 = safe_math::cbrt<double>(9.83585887740754e-318);
  dVar11 = piecewise_functor_3<double>((bool)(-(dVar17 != 0.0) & 1),dVar12 * 1e-15,dVar13 * dVar11);
  dVar10 = 1.0 - dVar10;
  dVar14 = (double)(-(ulong)(dVar10 <= 1e-15) & 0x3ff0000000000000);
  dVar15 = safe_math::cbrt<double>(9.83669878900547e-318);
  dVar12 = piecewise_functor_3<double>(dVar14 != 0.0,dVar12 * 1e-15,dVar15 * dVar10);
  dVar11 = (dVar11 + dVar12) - 2.0;
  dVar12 = dVar6 * dVar11 * 1.9236610509315362;
  dVar2 = (1.0 / dVar2) / dVar1;
  dVar10 = dVar2 * 1.720508027656199;
  dVar8 = dVar2 * 2.519842099789747 * dVar8;
  dVar2 = piecewise_functor_3<double>
                    (dVar4 != 0.0,
                     -(-0.1423 / (dVar7 * dVar7)) *
                     ((dVar10 * -0.4808460067404899) / 12.0 -
                     ((1.0 / dVar5) * 1.0529 * 1.4422495703074083 * dVar10) / 12.0),
                     (((dVar3 * -0.0311) / 3.0 - (dVar8 * 0.0019694900436853925) / 12.0) -
                     (dVar10 * 0.0028844991406148167) / 12.0) -
                     (dVar10 * -0.016730095015565934) / 12.0);
  dVar4 = piecewise_functor_3<double>
                    (dVar4 != 0.0,
                     -(-0.0843 / (dVar16 * dVar16)) *
                     ((-((1.0 / dVar5) * 1.3981 * 1.4422495703074083) * dVar10) / 12.0 -
                     (dVar10 * 0.37657136280726433) / 12.0),
                     (((dVar3 * -0.01555) / 3.0 - (dVar8 * 0.0006893215152898874) / 12.0) -
                     (dVar10 * 0.0010095746992151858) / 12.0) -
                     (dVar10 * -0.0069227979374755595) / 12.0);
  dVar4 = (dVar4 - dVar2) * dVar11 * 1.9236610509315362;
  dVar11 = (in_XMM0_Qa - in_XMM1_Qa) * (1.0 / (dVar1 * dVar1));
  dVar5 = dVar3 - dVar11;
  dVar7 = piecewise_functor_3<double>(dVar17 != 0.0,0.0,dVar13 * 1.3333333333333333 * dVar5);
  dVar5 = piecewise_functor_3<double>(dVar14 != 0.0,0.0,dVar15 * 1.3333333333333333 * -dVar5);
  dVar11 = -dVar3 - dVar11;
  dVar3 = piecewise_functor_3<double>(dVar17 != 0.0,0.0,dVar13 * 1.3333333333333333 * dVar11);
  dVar11 = piecewise_functor_3<double>(dVar14 != 0.0,0.0,dVar15 * 1.3333333333333333 * -dVar11);
  *in_RDI = dVar9 + dVar12;
  *in_RSI = dVar1 * (dVar2 + dVar4 + dVar6 * (dVar7 + dVar5) * 1.9236610509315362) + dVar9 + dVar12;
  *in_RDX = dVar1 * (dVar2 + dVar4 + dVar6 * (dVar3 + dVar11) * 1.9236610509315362) + dVar9 + dVar12
  ;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_vxc_polar_impl( double rho_a, double rho_b, double& eps, double& vrho_a, double& vrho_b ) {

    (void)(eps);
    constexpr double t1 = constants::m_cbrt_3;
    constexpr double t3 = constants::m_cbrt_one_ov_pi;
    constexpr double t5 = constants::m_cbrt_4;
    constexpr double t87 = constants::m_cbrt_2;
    constexpr double t6 = t5 * t5;
    constexpr double t14 = gamma_0;
    constexpr double t15 = beta1_0;
    constexpr double t20 = beta2_0 * t1;
    constexpr double t21 = t3 * t6;
    constexpr double t28 = a_0;
    constexpr double t33 = c_0 * t1;
    constexpr double t34 = t33 * t3;
    constexpr double t39 = d_0 * t1;
    constexpr double t44 = gamma_1;
    constexpr double t45 = beta1_1;
    constexpr double t49 = beta2_1 * t1;
    constexpr double t55 = a_1;
    constexpr double t59 = c_1 * t1;
    constexpr double t60 = t59 * t3;
    constexpr double t64 = d_1 * t1;


    const double t7 = rho_a + rho_b;
    const double t8 = safe_math::cbrt( t7 );
    const double t9 = 0.1e1 / t8;
    const double t10 = t6 * t9;
    const double t11 = t1 * t3 * t10;
    const double t12 = t11 / 0.4e1;
    const double t13 = 0.1e1 <= t12;
    const double t16 = safe_math::sqrt( t11 );
    const double t22 = t21 * t9;
    const double t25 = 0.1e1 + t15 * t16 / 0.2e1 + t20 * t22 / 0.4e1;
    const double t29 = safe_math::log( t12 );
    const double t35 = t10 * t29;
    const double t43 = piecewise_functor_3( t13, t14 / t25, t28 * t29 + b_0 + t34 * t35 / 0.4e1 + t39 * t22 / 0.4e1 );
    const double t52 = 0.1e1 + t45 * t16 / 0.2e1 + t49 * t22 / 0.4e1;
    const double t68 = piecewise_functor_3( t13, t44 / t52, t55 * t29 + b_1 + t60 * t35 / 0.4e1 + t64 * t22 / 0.4e1 );
    const double t69 = t68 - t43;
    const double t70 = rho_a - rho_b;
    const double t71 = 0.1e1 / t7;
    const double t72 = t70 * t71;
    const double t73 = 0.1e1 + t72;
    const double t74 = t73 <= zeta_tol;
    const double t75 = safe_math::cbrt( zeta_tol );
    const double t76 = t75 * zeta_tol;
    const double t77 = safe_math::cbrt( t73 );
    const double t79 = piecewise_functor_3( t74, t76, t77 * t73 );
    const double t80 = 0.1e1 - t72;
    const double t81 = t80 <= zeta_tol;
    const double t82 = safe_math::cbrt( t80 );
    const double t84 = piecewise_functor_3( t81, t76, t82 * t80 );
    const double t85 = t79 + t84 - 0.2e1;
    const double t90 = 0.1e1 / ( 0.2e1 * t87 - 0.2e1 );
    const double t91 = t69 * t85 * t90;
    const double t92 = t25 * t25;
    const double t94 = t14 / t92;
    const double t95 = 0.1e1 / t16;
    const double t97 = t15 * t95 * t1;
    const double t99 = 0.1e1 / t8 / t7;
    const double t100 = t21 * t99;
    const double t104 = -t20 * t100 / 0.12e2 - t97 * t100 / 0.12e2;
    const double t109 = t6 * t99 * t29;
    const double t117 = piecewise_functor_3( t13, -t94 * t104, -t28 * t71 / 0.3e1 - t34 * t109 / 0.12e2 - t33 * t100 / 0.12e2 - t39 * t100 / 0.12e2 );
    const double t118 = t52 * t52;
    const double t120 = t44 / t118;
    const double t122 = t45 * t95 * t1;
    const double t126 = -t122 * t100 / 0.12e2 - t49 * t100 / 0.12e2;
    const double t137 = piecewise_functor_3( t13, -t120 * t126, -t55 * t71 / 0.3e1 - t60 * t109 / 0.12e2 - t59 * t100 / 0.12e2 - t64 * t100 / 0.12e2 );
    const double t138 = t137 - t117;
    const double t140 = t138 * t85 * t90;
    const double t141 = t7 * t7;
    const double t142 = 0.1e1 / t141;
    const double t143 = t70 * t142;
    const double t144 = t71 - t143;
    const double t147 = piecewise_functor_3( t74, 0.0, 0.4e1 / 0.3e1 * t77 * t144 );
    const double t148 = -t144;
    const double t151 = piecewise_functor_3( t81, 0.0, 0.4e1 / 0.3e1 * t82 * t148 );
    const double t152 = t147 + t151;
    const double t154 = t69 * t152 * t90;
    const double t157 = -t71 - t143;
    const double t160 = piecewise_functor_3( t74, 0.0, 0.4e1 / 0.3e1 * t77 * t157 );
    const double t161 = -t157;
    const double t164 = piecewise_functor_3( t81, 0.0, 0.4e1 / 0.3e1 * t82 * t161 );
    const double t165 = t160 + t164;
    const double t167 = t69 * t165 * t90;


    eps = t43 + t91;
    vrho_a = t43 + t91 + t7 * ( t117 + t140 + t154 );
    vrho_b = t43 + t91 + t7 * ( t117 + t140 + t167 );

  }